

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectTest(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  bool bVar5;
  abctime clk;
  int iNode;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Gia_Man_t *p_local;
  
  vNodes = (Vec_Int_t *)p;
  aVar3 = Abc_Clock();
  pObj = (Gia_Obj_t *)Vec_IntAlloc(100);
  Gia_ManIncrementTravId((Gia_Man_t *)vNodes);
  clk._4_4_ = 0;
  while( true ) {
    iVar1 = clk._4_4_;
    iVar2 = Vec_IntSize((Vec_Int_t *)vNodes[4].pArray);
    bVar5 = false;
    if (iVar1 < iVar2) {
      _iNode = Gia_ManCo((Gia_Man_t *)vNodes,clk._4_4_);
      bVar5 = _iNode != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    clk._0_4_ = Gia_ObjId((Gia_Man_t *)vNodes,_iNode);
    Gia_ManCollectAnds((Gia_Man_t *)vNodes,(int *)&clk,1,(Vec_Int_t *)pObj,(Vec_Int_t *)0x0);
    clk._4_4_ = clk._4_4_ + 1;
  }
  Vec_IntFree((Vec_Int_t *)pObj);
  Abc_Print(1,"%s =","DFS from each output");
  aVar4 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  return;
}

Assistant:

void Gia_ManCollectTest( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, iNode;
    abctime clk = Abc_Clock();
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
    {
        iNode = Gia_ObjId(p, pObj);
        Gia_ManCollectAnds( p, &iNode, 1, vNodes, NULL );
    }
    Vec_IntFree( vNodes );
    ABC_PRT( "DFS from each output", Abc_Clock() - clk );
}